

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.cpp
# Opt level: O1

uint32_t * __thiscall spirv_cross::Parser::stream(Parser *this,Instruction *instr)

{
  pointer puVar1;
  uint32_t *puVar2;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (instr->length == 0) {
    puVar2 = (uint32_t *)0x0;
  }
  else {
    puVar1 = (this->ir).spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->ir).spirv.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <
        (ulong)(instr->length + instr->offset)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"Compiler::stream() out of range.","");
      ::std::runtime_error::runtime_error(this_00,(string *)local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar2 = puVar1 + instr->offset;
  }
  return puVar2;
}

Assistant:

const uint32_t *Parser::stream(const Instruction &instr) const
{
	// If we're not going to use any arguments, just return nullptr.
	// We want to avoid case where we return an out of range pointer
	// that trips debug assertions on some platforms.
	if (!instr.length)
		return nullptr;

	if (instr.offset + instr.length > ir.spirv.size())
		SPIRV_CROSS_THROW("Compiler::stream() out of range.");
	return &ir.spirv[instr.offset];
}